

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-parser.c++
# Opt level: O3

Maybe<kj::Own<capnp::SchemaFile>_> __thiscall
capnp::SchemaFile::DiskSchemaFile::import(DiskSchemaFile *this,StringPtr target)

{
  _func_int **pp_Var1;
  _func_int **pp_Var2;
  Path *params_1;
  String *pSVar3;
  size_t sVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  ulong in_RCX;
  DiskSchemaFile *extraout_RDX_00;
  DiskSchemaFile *extraout_RDX_01;
  DiskSchemaFile *pDVar7;
  DiskSchemaFile *extraout_RDX_02;
  DiskSchemaFile *extraout_RDX_03;
  DiskSchemaFile *extraout_RDX_04;
  DiskSchemaFile *extraout_RDX_05;
  DiskSchemaFile *extraout_RDX_06;
  long lVar8;
  ArrayDisposer *pAVar9;
  Own<capnp::SchemaFile::DiskSchemaFile> OVar10;
  Maybe<kj::Own<capnp::SchemaFile>_> MVar11;
  StringPtr path;
  StringPtr pathText;
  Path parsed;
  Path parsed_1;
  OwnOwn<const_kj::ReadableFile> newFile;
  Path local_218;
  char **local_200;
  Path local_1f8;
  Maybe<kj::String> local_1d8;
  undefined8 local_1b8;
  undefined4 uStack_1b0;
  undefined4 uStack_1ac;
  DiskSchemaFile *local_1a8;
  char *local_1a0 [2];
  Maybe<kj::Exception> local_190;
  DiskSchemaFile *extraout_RDX;
  
  pathText.content.ptr = (char *)target.content.size_;
  pAVar9 = (ArrayDisposer *)target.content.ptr;
  local_1a0[0] = pathText.content.ptr;
  if ((in_RCX < 2) || (*pathText.content.ptr != '/')) {
    local_218.parts._0_16_ = *(Own<const_kj::ReadableFile> *)(pAVar9 + 2);
    local_218.parts._0_16_ = kj::PathPtr::parent((PathPtr *)&local_218);
    pathText.content.size_ = in_RCX;
    kj::PathPtr::eval(&local_1f8,(PathPtr *)&local_218,pathText);
    local_1d8.ptr._0_8_ = local_1d8.ptr._0_8_ & 0xffffffffffffff00;
    if (*(char *)&pAVar9[0xc]._vptr_ArrayDisposer == '\x01') {
      local_218.parts.size_ = (size_t)&local_1d8;
      local_218.parts.ptr = (String *)&PTR_run_00626e48;
      local_200 = local_1a0;
      local_218.parts.disposer = pAVar9;
      kj::_::runCatchingExceptions(&local_190,(Runnable *)&local_218);
      if (local_190.ptr.isSet == true) {
        kj::Exception::~Exception(&local_190.ptr.field_1.value);
      }
    }
    (**(code **)(*pAVar9[1]._vptr_ArrayDisposer + 0x50))
              (&local_1b8,pAVar9[1]._vptr_ArrayDisposer,local_1f8.parts.ptr,local_1f8.parts.size_);
    local_218.parts.size_ = CONCAT44(uStack_1ac,uStack_1b0);
    local_218.parts.ptr = local_1b8;
    if ((ReadableFile *)local_218.parts.size_ == (ReadableFile *)0x0) {
      (this->super_SchemaFile)._vptr_SchemaFile = (_func_int **)0x0;
      this->baseDir = (ReadableDirectory *)0x0;
      pDVar7 = extraout_RDX_01;
    }
    else {
      OVar10 = kj::
               heap<capnp::SchemaFile::DiskSchemaFile,kj::ReadableDirectory_const&,kj::Path,kj::ArrayPtr<kj::ReadableDirectory_const*const>const&,kj::Own<kj::ReadableFile_const>,kj::Maybe<kj::String>>
                         ((kj *)&local_1b8,(ReadableDirectory *)pAVar9[1]._vptr_ArrayDisposer,
                          &local_1f8,(ArrayPtr<const_kj::ReadableDirectory_*const> *)(pAVar9 + 5),
                          (Own<const_kj::ReadableFile> *)&local_218,&local_1d8);
      sVar4 = local_218.parts.size_;
      pDVar7 = OVar10.ptr;
      *(undefined4 *)&(this->super_SchemaFile)._vptr_SchemaFile = (undefined4)local_1b8;
      *(undefined4 *)((long)&(this->super_SchemaFile)._vptr_SchemaFile + 4) = local_1b8._4_4_;
      *(undefined4 *)&this->baseDir = uStack_1b0;
      *(undefined4 *)((long)&this->baseDir + 4) = uStack_1ac;
      if ((ReadableFile *)local_218.parts.size_ != (ReadableFile *)0x0) {
        local_218.parts.size_ = 0;
        (**(code **)((local_218.parts.ptr)->content).ptr)
                  (local_218.parts.ptr,
                   (_func_int *)
                   ((long)&((FsNode *)sVar4)->_vptr_FsNode +
                   (long)((FsNode *)sVar4)->_vptr_FsNode[-2]));
        pDVar7 = extraout_RDX_02;
      }
    }
    uVar6 = local_1d8.ptr.field_1.value.content.size_;
    uVar5 = local_1d8.ptr.field_1.value.content.ptr;
    if ((local_1d8.ptr.isSet == true) &&
       ((long *)local_1d8.ptr.field_1.value.content.ptr != (long *)0x0)) {
      local_1d8.ptr.field_1.value.content.ptr = (char *)0x0;
      local_1d8.ptr.field_1.value.content.size_ = 0;
      (**(local_1d8.ptr.field_1.value.content.disposer)->_vptr_ArrayDisposer)
                (local_1d8.ptr.field_1.value.content.disposer,uVar5,1,uVar6,uVar6,0);
      pDVar7 = extraout_RDX_03;
    }
    sVar4 = local_1f8.parts.size_;
    pSVar3 = local_1f8.parts.ptr;
    if (local_1f8.parts.ptr != (String *)0x0) {
      local_1f8.parts.ptr = (String *)0x0;
      local_1f8.parts.size_ = 0;
      (**(local_1f8.parts.disposer)->_vptr_ArrayDisposer)
                (local_1f8.parts.disposer,pSVar3,0x18,sVar4,sVar4,
                 kj::ArrayDisposer::Dispose_<kj::String,_false>::destruct);
      pDVar7 = extraout_RDX_04;
    }
  }
  else {
    path.content.size_ = in_RCX;
    path.content.ptr = (char *)(in_RCX - 1);
    local_1a8 = this;
    kj::Path::parse(&local_218,(Path *)(pathText.content.ptr + 1),path);
    pp_Var1 = pAVar9[6]._vptr_ArrayDisposer;
    pDVar7 = extraout_RDX;
    if (pp_Var1 != (_func_int **)0x0) {
      pp_Var2 = pAVar9[5]._vptr_ArrayDisposer;
      lVar8 = 0;
      do {
        params_1 = *(Path **)((long)pp_Var2 + lVar8);
        (*(code *)(params_1->parts).ptr[3].content.size_)
                  (&local_1f8,params_1,local_218.parts.ptr,local_218.parts.size_);
        local_1d8.ptr._0_8_ = local_1f8.parts.ptr;
        local_1d8.ptr.field_1.value.content.ptr = (char *)local_1f8.parts.size_;
        if ((long *)local_1f8.parts.size_ != (long *)0x0) {
          local_1b8 = (String *)0x0;
          OVar10 = kj::
                   heap<capnp::SchemaFile::DiskSchemaFile,kj::ReadableDirectory_const&,kj::Path,kj::ArrayPtr<kj::ReadableDirectory_const*const>const&,kj::Own<kj::ReadableFile_const>,decltype(nullptr)>
                             ((ReadableDirectory *)&local_1f8,params_1,
                              (ArrayPtr<const_kj::ReadableDirectory_*const> *)&local_218,
                              (Own<const_kj::ReadableFile> *)(pAVar9 + 5),(void **)&local_1d8);
          this = local_1a8;
          uVar5 = local_1d8.ptr.field_1.value.content.ptr;
          pDVar7 = OVar10.ptr;
          *(undefined4 *)&(local_1a8->super_SchemaFile)._vptr_SchemaFile = local_1f8.parts.ptr._0_4_
          ;
          *(undefined4 *)((long)&(local_1a8->super_SchemaFile)._vptr_SchemaFile + 4) =
               local_1f8.parts.ptr._4_4_;
          *(undefined4 *)&local_1a8->baseDir = (undefined4)local_1f8.parts.size_;
          *(undefined4 *)((long)&local_1a8->baseDir + 4) = local_1f8.parts.size_._4_4_;
          if ((long *)local_1d8.ptr.field_1.value.content.ptr != (long *)0x0) {
            local_1d8.ptr.field_1.value.content.ptr = (char *)0x0;
            (*(code *)**(undefined8 **)local_1d8.ptr._0_8_)
                      (local_1d8.ptr._0_8_,(char *)(uVar5 + *(long *)(*(long *)uVar5 + -0x10)));
            pDVar7 = extraout_RDX_05;
          }
          goto LAB_00411f6d;
        }
        lVar8 = lVar8 + 8;
        pDVar7 = extraout_RDX_00;
      } while ((long)pp_Var1 << 3 != lVar8);
    }
    (local_1a8->super_SchemaFile)._vptr_SchemaFile = (_func_int **)0x0;
    local_1a8->baseDir = (ReadableDirectory *)0x0;
    this = local_1a8;
LAB_00411f6d:
    pSVar3 = local_218.parts.ptr;
    if (local_218.parts.ptr != (String *)0x0) {
      sVar4 = local_218.parts.size_;
      local_218.parts._0_16_ = ZEXT816(0);
      (**(local_218.parts.disposer)->_vptr_ArrayDisposer)
                (local_218.parts.disposer,pSVar3,0x18,sVar4,sVar4,
                 kj::ArrayDisposer::Dispose_<kj::String,_false>::destruct);
      pDVar7 = extraout_RDX_06;
    }
  }
  MVar11.ptr.ptr = &pDVar7->super_SchemaFile;
  MVar11.ptr.disposer = (Disposer *)this;
  return (Maybe<kj::Own<capnp::SchemaFile>_>)MVar11.ptr;
}

Assistant:

kj::Maybe<kj::Own<SchemaFile>> import(kj::StringPtr target) const override {
    if (target.startsWith("/")) {
      auto parsed = kj::Path::parse(target.slice(1));
      for (auto candidate: importPath) {
        KJ_IF_MAYBE(newFile, candidate->tryOpenFile(parsed)) {
          return kj::implicitCast<kj::Own<SchemaFile>>(kj::heap<DiskSchemaFile>(
              *candidate, kj::mv(parsed), importPath, kj::mv(*newFile), nullptr));
        }
      }
      return nullptr;
    } else {
      auto parsed = path.parent().eval(target);

      kj::Maybe<kj::String> displayNameOverride;
      if (displayNameOverridden) {
        // Try to create a consistent display name override for the imported file. This is for
        // backwards-compatibility only -- display names are only overridden when using the
        // deprecated parseDiskFile() interface.
        kj::runCatchingExceptions([&]() {
          displayNameOverride = kj::Path::parse(displayName).parent().eval(target).toString();
        });
      }

      KJ_IF_MAYBE(newFile, baseDir.tryOpenFile(parsed)) {
        return kj::implicitCast<kj::Own<SchemaFile>>(kj::heap<DiskSchemaFile>(
            baseDir, kj::mv(parsed), importPath, kj::mv(*newFile), kj::mv(displayNameOverride)));
      } else {
        return nullptr;
      }
    }
  }